

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O1

void tcg_gen_gvec_mov_mips64
               (TCGContext_conflict5 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz)

{
  uint32_t oprsz_00;
  
  if (dofs == aofs) {
    oprsz_00 = maxsz - oprsz;
    if (oprsz <= maxsz && oprsz_00 != 0) {
      do_dup(tcg_ctx,0,oprsz + dofs,oprsz_00,oprsz_00,(TCGv_i32)0x0,(TCGv_i64)0x0,0);
    }
    return;
  }
  tcg_gen_gvec_2_mips64(tcg_ctx,dofs,aofs,oprsz,maxsz,&tcg_gen_gvec_mov_mips64::g);
  return;
}

Assistant:

void tcg_gen_gvec_mov(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                      uint32_t oprsz, uint32_t maxsz)
{
    static const GVecGen2 g = {
        .fni8 = tcg_gen_mov_i64,
        .fniv = vec_mov2,
        .fno = gen_helper_gvec_mov,
        .prefer_i64 = TCG_TARGET_REG_BITS == 64,
    };
    if (dofs != aofs) {
        tcg_gen_gvec_2(tcg_ctx, dofs, aofs, oprsz, maxsz, &g);
    } else {
        check_size_align(oprsz, maxsz, dofs);
        if (oprsz < maxsz) {
            expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
        }
    }
}